

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::XMLAttribute::ParseDeep(XMLAttribute *this,char *p,bool processEntities)

{
  int strFlags;
  char local_23 [3];
  char endTag [2];
  char *pcStack_20;
  bool processEntities_local;
  char *p_local;
  XMLAttribute *this_local;
  
  local_23[2] = processEntities;
  pcStack_20 = p;
  pcStack_20 = StrPair::ParseName(&this->_name,p);
  if ((pcStack_20 == (char *)0x0) || (*pcStack_20 == '\0')) {
    this_local = (XMLAttribute *)0x0;
  }
  else {
    pcStack_20 = XMLUtil::SkipWhiteSpace(pcStack_20);
    if (*pcStack_20 == '=') {
      pcStack_20 = pcStack_20 + 1;
      pcStack_20 = XMLUtil::SkipWhiteSpace(pcStack_20);
      if ((*pcStack_20 == '\"') || (*pcStack_20 == '\'')) {
        local_23[0] = *pcStack_20;
        local_23[1] = 0;
        pcStack_20 = pcStack_20 + 1;
        strFlags = 2;
        if ((local_23[2] & 1U) != 0) {
          strFlags = 3;
        }
        this_local = (XMLAttribute *)StrPair::ParseText(&this->_value,pcStack_20,local_23,strFlags);
      }
      else {
        this_local = (XMLAttribute *)0x0;
      }
    }
    else {
      this_local = (XMLAttribute *)0x0;
    }
  }
  return (char *)this_local;
}

Assistant:

char* XMLAttribute::ParseDeep( char* p, bool processEntities )
{
    // Parse using the name rules: bug fix, was using ParseText before
    p = _name.ParseName( p );
    if ( !p || !*p ) {
        return 0;
    }

    // Skip white space before =
    p = XMLUtil::SkipWhiteSpace( p );
    if ( *p != '=' ) {
        return 0;
    }

    ++p;	// move up to opening quote
    p = XMLUtil::SkipWhiteSpace( p );
    if ( *p != '\"' && *p != '\'' ) {
        return 0;
    }

    char endTag[2] = { *p, 0 };
    ++p;	// move past opening quote

    p = _value.ParseText( p, endTag, processEntities ? StrPair::ATTRIBUTE_VALUE : StrPair::ATTRIBUTE_VALUE_LEAVE_ENTITIES );
    return p;
}